

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O2

void __thiscall
cfd::core::CfdCoreManager::Finalize
          (CfdCoreManager *this,CfdCoreHandle handle,bool is_finish_process)

{
  pointer ppiVar1;
  pointer ppiVar2;
  const_iterator __position;
  CfdCoreHandle local_50;
  CfdSourceLocation local_48;
  
  if ((this->initialized_ == true) &&
     ((this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    local_50 = handle;
    ::std::mutex::lock(&this->mutex_);
    ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppiVar1 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (__position._M_current = ppiVar1; __position._M_current != ppiVar2;
        __position._M_current = __position._M_current + 1) {
      if (*__position._M_current == (int *)handle) {
        if (handle != (CfdCoreHandle)0x0) {
          operator_delete__(handle);
        }
        if (!is_finish_process) {
          local_48.filename = "cfdcore_manager.cpp";
          local_48.line = 0x6f;
          local_48.funcname = "Finalize";
          logger::info<void*const&>(&local_48,"core finalize. addr={:p}.",&local_50);
        }
        ::std::vector<int_*,_std::allocator<int_*>_>::erase(&this->handle_list_,__position);
        ppiVar1 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppiVar2 = (this->handle_list_).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        break;
      }
    }
    if (ppiVar1 == ppiVar2) {
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
      this->finalized_ = true;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  }
  return;
}

Assistant:

void CfdCoreManager::Finalize(
    const CfdCoreHandle handle, bool is_finish_process) {
  if (initialized_ && (!handle_list_.empty())) {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);

    std::vector<int*>::iterator ite;
    for (ite = handle_list_.begin(); ite != handle_list_.end(); ++ite) {
      if (handle == *ite) {
        delete[] static_cast<int*>(handle);
        if (!is_finish_process) {
          info(CFD_LOG_SOURCE, "core finalize. addr={:p}.", handle);
        }
        handle_list_.erase(ite);
        break;
      }
    }

    if (handle_list_.empty()) {
      // Perform end processing
      FinalizeLogger(is_finish_process);
      wally_cleanup(0);
#if 0
      hid_exit();
#endif
      finalized_ = true;
    }
  }
}